

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# connection2.c
# Opt level: O2

void ssh2_channel_free(ssh2_channel *c)

{
  outstanding_channel_request *ptr;
  Channel *pCVar1;
  ssh2_connection_state *psVar2;
  
  bufchain_clear(&c->outbuffer);
  bufchain_clear(&c->errbuffer);
  while (ptr = c->chanreq_head, ptr != (outstanding_channel_request *)0x0) {
    c->chanreq_head = ptr->next;
    safefree(ptr);
  }
  pCVar1 = c->chan;
  if (pCVar1 != (Channel *)0x0) {
    psVar2 = c->connlayer;
    if (psVar2->mainchan_sc == &c->sc) {
      psVar2->mainchan = (mainchan *)0x0;
      psVar2->mainchan_sc = (SshChannel *)0x0;
    }
    (*pCVar1->vt->free)(pCVar1);
  }
  safefree(c);
  return;
}

Assistant:

static void ssh2_channel_free(struct ssh2_channel *c)
{
    bufchain_clear(&c->outbuffer);
    bufchain_clear(&c->errbuffer);
    while (c->chanreq_head) {
        struct outstanding_channel_request *chanreq = c->chanreq_head;
        c->chanreq_head = c->chanreq_head->next;
        sfree(chanreq);
    }
    if (c->chan) {
        struct ssh2_connection_state *s = c->connlayer;
        if (s->mainchan_sc == &c->sc) {
            s->mainchan = NULL;
            s->mainchan_sc = NULL;
        }
        chan_free(c->chan);
    }
    sfree(c);
}